

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vmsumuhm_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  uint local_5c;
  int iStack_58;
  int i;
  uint32_t prod [8];
  ppc_avr_t *c_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  CPUPPCState_conflict2 *env_local;
  
  for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
    (&iStack_58)[(int)local_5c] = (uint)a->u16[(int)local_5c] * (uint)b->u16[(int)local_5c];
  }
  for (local_5c = 3; -1 < (int)local_5c; local_5c = local_5c + -1) {
    r->u32[(int)local_5c] =
         c->u32[(int)local_5c] + (&iStack_58)[(int)(local_5c << 1)] +
         (&iStack_58)[(int)(local_5c * 2 + 1)];
  }
  return;
}

Assistant:

void helper_vmsumuhm(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    uint32_t prod[8];
    int i;

    for (i = 0; i < ARRAY_SIZE(r->u16); i++) {
        prod[i] = a->u16[i] * b->u16[i];
    }

    VECTOR_FOR_INORDER_I(i, u32) {
        r->u32[i] = c->u32[i] + prod[2 * i] + prod[2 * i + 1];
    }
}